

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

void Ses_StoreRead(Ses_Store_t *pStore,char *pFilename,int fSynthImp,int fSynthRL,int fUnsynthImp,
                  int fUnsynthRL)

{
  FILE *__stream;
  int value;
  FILE *pFile;
  char *pNetwork;
  int local_88;
  char pHeader [3];
  int pArrTimeProfile [8];
  int local_60;
  int local_5c;
  int fResLimit;
  int nVars;
  word pTruth [4];
  unsigned_long nEntries;
  int i;
  int fUnsynthRL_local;
  int fUnsynthImp_local;
  int fSynthRL_local;
  int fSynthImp_local;
  char *pFilename_local;
  Ses_Store_t *pStore_local;
  
  if (pStore->szDBName == (char *)0x0) {
    __stream = fopen(pFilename,"rb");
    if (__stream == (FILE *)0x0) {
      printf("cannot open file \"%s\" for reading\n",pFilename);
    }
    else {
      fread(pTruth + 3,8,1,__stream);
      for (nEntries._4_4_ = 0; nEntries._4_4_ < (int)pTruth[3]; nEntries._4_4_ = nEntries._4_4_ + 1)
      {
        fread(&fResLimit,8,4,__stream);
        fread(&local_5c,4,1,__stream);
        fread(&local_88,4,8,__stream);
        fread(&local_60,4,1,__stream);
        fread((void *)((long)&pNetwork + 5),1,3,__stream);
        if (pNetwork._5_1_ == '\0') {
          pFile = (FILE *)0x0;
        }
        else {
          pFile = (FILE *)calloc((long)(pNetwork._7_1_ * 4 + 5 + (int)pNetwork._5_1_),1);
          *(char *)&pFile->_flags = pNetwork._5_1_;
          *(undefined1 *)((long)&pFile->_flags + 1) = pNetwork._6_1_;
          *(char *)((long)&pFile->_flags + 2) = pNetwork._7_1_;
          fread((void *)((long)&pFile->_flags + 3),1,
                (long)(pNetwork._7_1_ * 4 + 2 + (int)pNetwork._5_1_),__stream);
        }
        if (((((fSynthImp != 0) || (pFile == (FILE *)0x0)) || (local_60 != 0)) &&
            ((((fSynthRL != 0 || (pFile == (FILE *)0x0)) || (local_60 == 0)) &&
             (((fUnsynthImp != 0 || (pFile != (FILE *)0x0)) || (local_60 != 0)))))) &&
           (((fUnsynthRL != 0 || (pFile != (FILE *)0x0)) || (local_60 == 0)))) {
          Ses_StoreAddEntry(pStore,(word *)&fResLimit,local_5c,&local_88,(char *)pFile,local_60);
        }
      }
      fclose(__stream);
      printf("read %lu entries from file\n",pTruth[3]);
    }
  }
  else {
    printf("cannot read from database when szDBName is set");
  }
  return;
}

Assistant:

static void Ses_StoreRead( Ses_Store_t * pStore, const char * pFilename, int fSynthImp, int fSynthRL, int fUnsynthImp, int fUnsynthRL )
{
    int i;
    unsigned long nEntries;
    word pTruth[4];
    int nVars, fResLimit;
    int pArrTimeProfile[8];
    char pHeader[3];
    char * pNetwork;
    FILE * pFile;
    int value;

    if ( pStore->szDBName )
    {
        printf( "cannot read from database when szDBName is set" );
        return;
    }

    pFile = fopen( pFilename, "rb" );
    if (pFile == NULL)
    {
        printf( "cannot open file \"%s\" for reading\n", pFilename );
        return;
    }

    value = fread( &nEntries, sizeof( unsigned long ), 1, pFile );

    for ( i = 0; i < (int)nEntries; ++i )
    {
        value = fread( pTruth, sizeof( word ), 4, pFile );
        value = fread( &nVars, sizeof( int ), 1, pFile );
        value = fread( pArrTimeProfile, sizeof( int ), 8, pFile );
        value = fread( &fResLimit, sizeof( int ), 1, pFile );
        value = fread( pHeader, sizeof( char ), 3, pFile );

        if ( pHeader[0] == '\0' )
            pNetwork = NULL;
        else
        {
            pNetwork = ABC_CALLOC( char, 3 + 4 * pHeader[ABC_EXACT_SOL_NGATES] + 2 + pHeader[ABC_EXACT_SOL_NVARS] );
            pNetwork[0] = pHeader[0];
            pNetwork[1] = pHeader[1];
            pNetwork[2] = pHeader[2];

            value = fread( pNetwork + 3, sizeof( char ), 4 * pHeader[ABC_EXACT_SOL_NGATES] + 2 + pHeader[ABC_EXACT_SOL_NVARS], pFile );
        }

        if ( !fSynthImp && pNetwork && !fResLimit )    continue;
        if ( !fSynthRL && pNetwork && fResLimit )      continue;
        if ( !fUnsynthImp && !pNetwork && !fResLimit ) continue;
        if ( !fUnsynthRL && !pNetwork && fResLimit )   continue;

        Ses_StoreAddEntry( pStore, pTruth, nVars, pArrTimeProfile, pNetwork, fResLimit );
    }

    fclose( pFile );

    printf( "read %lu entries from file\n", (long)nEntries );
}